

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O1

void __thiscall
helics::apps::RampGenerator::set(RampGenerator *this,string_view parameter,double val)

{
  long lVar1;
  int iVar2;
  size_type __rlen;
  
  if (parameter._M_len == 4) {
    iVar2 = bcmp(parameter._M_str,"ramp",4);
    if (iVar2 == 0) {
      this->ramp = val;
LAB_0020fc41:
      lVar1 = (this->super_SignalGenerator).lastTime.internalTimeCode;
      if ((this->super_SignalGenerator).keyTime.internalTimeCode < lVar1) {
        (this->super_SignalGenerator).keyTime.internalTimeCode = lVar1;
      }
      return;
    }
  }
  else if ((parameter._M_len == 5) && (iVar2 = bcmp(parameter._M_str,"level",5), iVar2 == 0)) {
    this->level = val;
    goto LAB_0020fc41;
  }
  SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
  return;
}

Assistant:

void RampGenerator::set(std::string_view parameter, double val)
    {
        if (parameter == "level") {
            level = val;
            if (lastTime > keyTime) {
                keyTime = lastTime;
            }
        } else if (parameter == "ramp") {
            ramp = val;
            if (lastTime > keyTime) {
                keyTime = lastTime;
            }
        } else {
            SignalGenerator::set(parameter, val);
        }
    }